

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.h
# Opt level: O2

String * __thiscall
capnp::TextCodec::encode<capnp::DynamicStruct::Reader>
          (String *__return_storage_ptr__,TextCodec *this,Reader *value)

{
  Reader local_50;
  
  local_50.field_1._48_8_ = *(undefined8 *)&(value->reader).nestingLimit;
  local_50.field_1.intValue = (int64_t)(value->schema).super_Schema.raw;
  local_50.field_1.textValue.super_StringPtr.content.size_ = (size_t)(value->reader).segment;
  local_50.field_1.listValue.reader.segment = (SegmentReader *)(value->reader).capTable;
  local_50.field_1.listValue.reader.capTable = (CapTableReader *)(value->reader).data;
  local_50.field_1.listValue.reader.ptr = (byte *)(value->reader).pointers;
  local_50.field_1._40_4_ = (value->reader).dataSize;
  local_50.field_1._44_2_ = (value->reader).pointerCount;
  local_50.field_1._46_2_ = *(undefined2 *)&(value->reader).field_0x26;
  local_50.type = STRUCT;
  encode(__return_storage_ptr__,this,&local_50);
  DynamicValue::Reader::~Reader(&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline kj::String TextCodec::encode(T&& value) const {
  return encode(DynamicValue::Reader(ReaderFor<FromAny<T>>(kj::fwd<T>(value))));
}